

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_chunk_test.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::FindNextTest_AllUnequal_Test::
~FindNextTest_AllUnequal_Test(FindNextTest_AllUnequal_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(FindNextTest, AllUnequal) {
  const char* field_names[] = {"optional_int32", "optional_int64"};
  auto chunks = CreateAndCollectFields<TestAllTypes>(
      field_names, [](const FieldDescriptor* lhs, const FieldDescriptor* rhs) {
        return false;
      });
  auto it = FindNextUnequalChunk(
      chunks.begin(), chunks.end(),
      [](const FieldChunk&, const FieldChunk&) { return false; });

  ASSERT_NE(it, chunks.end());
  EXPECT_EQ(it->fields, chunks[1].fields);
}